

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicClass.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::geometry::GeometryExpanderRenderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GeometryExpanderRenderTestInstance *this)

{
  VkRenderPass VVar1;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  Context *context;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  RefData<vk::Handle<(vk::HandleType)17>_> data;
  RefData<vk::Handle<(vk::HandleType)13>_> data_00;
  RefData<vk::Handle<(vk::HandleType)23>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  RefData<vk::Handle<(vk::HandleType)18>_> data_04;
  IVec2 IVar4;
  bool bVar5;
  bool bVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 height;
  VkBool32 VVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  VkImage *pVVar13;
  Handle<(vk::HandleType)17> *pHVar14;
  Handle<(vk::HandleType)13> *pHVar15;
  Handle<(vk::HandleType)24> *pHVar16;
  size_t sVar17;
  size_t sVar18;
  ProgramCollection<vk::ProgramBinary> *pPVar19;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  char *__s;
  GraphicsPipelineBuilder *pGVar20;
  ProgramBinary *pPVar21;
  Handle<(vk::HandleType)16> *pHVar22;
  VkDeviceSize bufferSize;
  Allocation *pAVar23;
  void *pvVar24;
  reference pvVar25;
  undefined8 *puVar26;
  VkDeviceSize VVar27;
  VkCommandBuffer_s **ppVVar28;
  Handle<(vk::HandleType)23> *pHVar29;
  Handle<(vk::HandleType)18> *pHVar30;
  VkBuffer *pVVar31;
  VkVertexInputAttributeDescription VVar32;
  VkImageSubresourceLayers subresourceLayers;
  VkVertexInputBindingDescription vertexBinding;
  VkExtent3D extent;
  allocator<char> local_949;
  string local_948;
  undefined4 local_928;
  allocator<char> local_921;
  string local_920;
  string local_900;
  TextureFormat local_8e0;
  undefined1 local_8d8 [8];
  ConstPixelBufferAccess imagePixelAccess;
  Allocation *colorBufferAlloc;
  undefined1 local_898 [8];
  VkBufferMemoryBarrier postCopyBarrier;
  undefined1 local_810 [8];
  VkBufferImageCopy copyRegion;
  undefined1 local_7b8 [8];
  VkImageMemoryBarrier colorAttachmentPreCopyBarrier;
  VkDeviceSize offsets [1];
  VkBuffer buffers [1];
  undefined1 local_748 [8];
  Vec4 clearColor;
  VkRect2D renderArea;
  undefined1 local_700 [8];
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  int local_6ac;
  int ndx;
  DataVec4 *pData;
  Allocation *alloc;
  VkBufferCreateInfo local_690;
  undefined1 local_658 [8];
  Buffer vertexBuffer;
  VkBufferCreateInfo local_620;
  undefined1 local_5e8 [8];
  Buffer colorBuffer;
  VkDeviceSize colorBufferSizeBytes;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  GraphicsPipelineBuilder local_500;
  Move<vk::Handle<(vk::HandleType)18>_> local_3f8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_3d8;
  undefined1 local_3b8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  string local_390;
  undefined1 local_370 [8];
  string geometryShaderName;
  deUint32 vertexAtrrOffset;
  deUint32 vertexPositionsOffset;
  VkDeviceSize vertexDataSizeBytes;
  Move<vk::VkCommandBuffer_s_*> local_338;
  RefData<vk::VkCommandBuffer_s_*> local_318;
  undefined1 local_2f8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_2b8;
  undefined1 local_298 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)23>_> local_268;
  RefData<vk::Handle<(vk::HandleType)23>_> local_248;
  undefined1 local_228 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  Move<vk::Handle<(vk::HandleType)13>_> local_1e8;
  RefData<vk::Handle<(vk::HandleType)13>_> local_1c8;
  undefined1 local_1a8 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorAttachmentView;
  VkImageSubresourceRange colorSubRange;
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)17>_> local_140;
  RefData<vk::Handle<(vk::HandleType)17>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  VkImageCreateInfo local_d8;
  undefined1 local_80 [8];
  Image colorAttachmentImage;
  VkFormat colorFormat;
  IVec2 resolution;
  Allocator *memAlloc;
  VkQueue queue;
  deUint32 queueFamilyIndex;
  VkDevice device;
  DeviceInterface *vk;
  GeometryExpanderRenderTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  dVar7 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  resolution.m_data = (int  [2])Context::getDefaultAllocator((this->super_TestInstance).m_context);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffb8,0x100,0x100);
  IVar4.m_data = resolution.m_data;
  colorAttachmentImage.m_allocation.
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_ = 0x25;
  makeImageCreateInfo(&local_d8,(Vector<int,_2> *)&stack0xffffffffffffffb8,VK_FORMAT_R8G8B8A8_UNORM,
                      0x11,1);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator._4_4_ =
       ::vk::MemoryRequirement::Any.m_flags;
  geometry::Image::Image
            ((Image *)local_80,vk_00,device_00,(Allocator *)IVar4.m_data,&local_d8,
             ::vk::MemoryRequirement::Any);
  makeRenderPass(&local_140,vk_00,device_00,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data.deleter.m_deviceIface._0_4_ = (int)local_120.deleter.m_deviceIface;
  data.object.m_internal = local_120.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_120.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_120.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_120.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_120.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_120.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_100,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_140);
  (*(this->super_TestInstance)._vptr_TestInstance[3])
            (&colorSubRange.baseArrayLayer,this,vk_00,device_00);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)
             ((long)&colorAttachmentView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                     deleter.m_allocator + 4),1,0,1,0,1);
  pVVar13 = geometry::Image::operator*((Image *)local_80);
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       stack0xfffffffffffffe7c;
  subresourceRange.levelCount = colorSubRange.aspectMask;
  subresourceRange._0_8_ = stack0xfffffffffffffe7c;
  subresourceRange.baseArrayLayer = colorSubRange.baseMipLevel;
  subresourceRange.layerCount = colorSubRange.levelCount;
  makeImageView(&local_1e8,vk_00,device_00,(VkImage)pVVar13->m_internal,VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c8,(Move *)&local_1e8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_1c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_1c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_1c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_1c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_1c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_1c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_1a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_1e8);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_100);
  VVar1.m_internal = pHVar14->m_internal;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_1a8);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar15->m_internal;
  dVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb8);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb8);
  makeFramebuffer(&local_268,vk_00,device_00,VVar1,
                  (VkImageView)
                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
                  dVar8,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_248,(Move *)&local_268);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_248.deleter.m_deviceIface;
  data_01.object.m_internal = local_248.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_248.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_248.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_248.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_248.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_248.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_228,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_268);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,device_00
             ,2,dVar7,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2b8,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_2b8.deleter.m_deviceIface;
  data_02.object.m_internal = local_2b8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2b8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_2b8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_2b8.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_2b8.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_2b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_298,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_298);
  ::vk::allocateCommandBuffer
            (&local_338,vk_00,device_00,(VkCommandPool)pHVar16->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_318,(Move *)&local_338);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_318.deleter.m_deviceIface;
  data_03.object = local_318.object;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_318.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_318.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_318.deleter.m_device >> 0x20);
  data_03.deleter.m_pool.m_internal._0_4_ = (int)local_318.deleter.m_pool.m_internal;
  data_03.deleter.m_pool.m_internal._4_4_ = (int)(local_318.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_2f8,data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_338);
  sVar17 = sizeInBytes<tcu::Vector<float,4>>(&this->m_vertexPosData);
  sVar18 = sizeInBytes<tcu::Vector<float,4>>(&this->m_vertexAttrData);
  geometryShaderName.field_2._12_4_ = 0;
  geometryShaderName.field_2._8_4_ = 0x10;
  pPVar19 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"geometry_pointsize",
             (allocator<char> *)
             ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 7));
  bVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::contains(pPVar19,&local_390);
  bVar6 = false;
  if (bVar5) {
    vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
    physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    VVar9 = checkPointSize(vki,physDevice);
    bVar6 = VVar9 != 0;
  }
  __s = "geometry";
  if (bVar6) {
    __s = "geometry_pointsize";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_370,__s,
             (allocator<char> *)
             ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 6));
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 7));
  GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_500);
  pGVar20 = GraphicsPipelineBuilder::setRenderSize(&local_500,(IVec2 *)&stack0xffffffffffffffb8);
  pPVar19 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"vertex",&local_521);
  pPVar21 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar19,&local_520);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      (pGVar20,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar21,
                       (VkSpecializationInfo *)0x0);
  pPVar19 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pPVar21 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar19,(string *)local_370);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      (pGVar20,vk_00,device_00,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar21,
                       (VkSpecializationInfo *)0x0);
  pPVar19 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"fragment",&local_549);
  pPVar21 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar19,&local_548);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      (pGVar20,vk_00,device_00,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar21,
                       (VkSpecializationInfo *)0x0);
  vertexBinding = ::vk::makeVertexInputBindingDescription(0,0x20,VK_VERTEX_INPUT_RATE_VERTEX);
  pGVar20 = GraphicsPipelineBuilder::addVertexBinding(pGVar20,vertexBinding);
  VVar32 = ::vk::makeVertexInputAttributeDescription(0,0,VK_FORMAT_R32G32B32A32_SFLOAT,0);
  pGVar20 = GraphicsPipelineBuilder::addVertexAttribute(pGVar20,VVar32);
  VVar32 = ::vk::makeVertexInputAttributeDescription(1,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10);
  pGVar20 = GraphicsPipelineBuilder::addVertexAttribute(pGVar20,VVar32);
  pGVar20 = GraphicsPipelineBuilder::setPrimitiveTopology(pGVar20,this->m_primitiveType);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&colorSubRange.baseArrayLayer);
  pipelineLayout_00.m_internal = pHVar22->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_100);
  GraphicsPipelineBuilder::build
            (&local_3f8,pGVar20,vk_00,device_00,pipelineLayout_00,(VkRenderPass)pHVar14->m_internal)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3d8,(Move *)&local_3f8);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_3d8.deleter.m_deviceIface;
  data_04.object.m_internal = local_3d8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3d8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_3d8.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_3d8.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_3d8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_3d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_3b8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_3f8);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_500);
  iVar10 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb8);
  iVar11 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb8);
  colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar12 = tcu::getPixelSize((TextureFormat)
                             colorBuffer.m_allocation.
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data._8_8_);
  IVar4 = resolution;
  bufferSize = (VkDeviceSize)(iVar10 * iVar11 * iVar12);
  makeBufferCreateInfo(&local_620,bufferSize,2);
  vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._12_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  geometry::Buffer::Buffer
            ((Buffer *)local_5e8,vk_00,device_00,(Allocator *)IVar4.m_data,&local_620,
             ::vk::MemoryRequirement::HostVisible);
  IVar4 = resolution;
  makeBufferCreateInfo(&local_690,sVar17 + sVar18,0x80);
  geometry::Buffer::Buffer
            ((Buffer *)local_658,vk_00,device_00,(Allocator *)IVar4.m_data,&local_690,
             ::vk::MemoryRequirement::HostVisible);
  pAVar23 = geometry::Buffer::getAllocation((Buffer *)local_658);
  pvVar24 = ::vk::Allocation::getHostPtr(pAVar23);
  for (local_6ac = 0; local_6ac < this->m_numDrawVertices; local_6ac = local_6ac + 1) {
    pvVar25 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_vertexPosData,(long)local_6ac);
    puVar26 = (undefined8 *)((long)pvVar24 + (long)local_6ac * 0x20);
    *puVar26 = *(undefined8 *)pvVar25->m_data;
    puVar26[1] = *(undefined8 *)(pvVar25->m_data + 2);
    pvVar25 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_vertexAttrData,(long)local_6ac);
    *(undefined8 *)((long)pvVar24 + (long)local_6ac * 0x20 + 0x10) = *(undefined8 *)pvVar25->m_data;
    *(undefined8 *)((long)pvVar24 + (long)local_6ac * 0x20 + 0x18) =
         *(undefined8 *)(pvVar25->m_data + 2);
  }
  colorAttachmentLayoutBarrier._64_8_ = ::vk::Allocation::getMemory(pAVar23);
  VVar27 = ::vk::Allocation::getOffset(pAVar23);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,(VkDeviceMemory)colorAttachmentLayoutBarrier._64_8_,VVar27,
             sVar17 + sVar18);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  beginCommandBuffer(vk_00,*ppVVar28);
  pVVar13 = geometry::Image::operator*((Image *)local_80);
  subresourceRange_00.levelCount = colorSubRange.aspectMask;
  subresourceRange_00._0_8_ = stack0xfffffffffffffe7c;
  subresourceRange_00.baseArrayLayer = colorSubRange.baseMipLevel;
  subresourceRange_00.layerCount = colorSubRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_700,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,(VkImage)pVVar13->m_internal,
             subresourceRange_00);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar28,1,0x80,0,0,0,0,0,1,local_700);
  clearColor.m_data._8_8_ = ::vk::makeOffset2D(0,0);
  dVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb8);
  dVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb8);
  ::vk::makeExtent2D(dVar7,dVar8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_748,0.0,0.0,0.0,1.0);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  commandBuffer = *ppVVar28;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_100);
  VVar1.m_internal = pHVar14->m_internal;
  pHVar29 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_228);
  beginRenderPass(vk_00,commandBuffer,VVar1,(VkFramebuffer)pHVar29->m_internal,
                  (VkRect2D *)(clearColor.m_data + 2),(Vec4 *)local_748);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  pVVar2 = *ppVVar28;
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_3b8);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,0,pHVar30->m_internal);
  pVVar31 = geometry::Buffer::get((Buffer *)local_658);
  offsets[0] = pVVar31->m_internal;
  colorAttachmentPreCopyBarrier.subresourceRange.layerCount = 0;
  colorAttachmentPreCopyBarrier._68_4_ = 0;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  (*vk_00->_vptr_DeviceInterface[0x58])
            (vk_00,*ppVVar28,0,1,offsets,&colorAttachmentPreCopyBarrier.subresourceRange.layerCount)
  ;
  IVar4 = resolution;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&colorSubRange.baseArrayLayer);
  (*(this->super_TestInstance)._vptr_TestInstance[4])
            (this,vk_00,device_00,IVar4.m_data,ppVVar28,pHVar22);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,ppVVar28);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  endRenderPass(vk_00,*ppVVar28);
  pVVar13 = geometry::Image::operator*((Image *)local_80);
  copyRegion.imageExtent._4_8_ = stack0xfffffffffffffe7c;
  subresourceRange_01.levelCount = colorSubRange.aspectMask;
  subresourceRange_01._0_8_ = stack0xfffffffffffffe7c;
  subresourceRange_01.baseArrayLayer = colorSubRange.baseMipLevel;
  subresourceRange_01.layerCount = colorSubRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_7b8,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar13->m_internal,subresourceRange_01);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar28,0x400,0x1000,0,0,0,0,0,1,local_7b8);
  dVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb8);
  dVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb8);
  extent = ::vk::makeExtent3D(dVar7,dVar8,1);
  subresourceLayers = ::vk::makeImageSubresourceLayers(1,0,0,1);
  makeBufferImageCopy((VkBufferImageCopy *)local_810,extent,subresourceLayers);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  pVVar2 = *ppVVar28;
  pVVar13 = geometry::Image::operator*((Image *)local_80);
  dVar3 = pVVar13->m_internal;
  pVVar31 = geometry::Buffer::operator*((Buffer *)local_5e8);
  postCopyBarrier.size = pVVar31->m_internal;
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar2,dVar3,6,postCopyBarrier.size,1,(int)local_810);
  pVVar31 = geometry::Buffer::operator*((Buffer *)local_5e8);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_898,0x1000,0x2000,(VkBuffer)pVVar31->m_internal,0,
             bufferSize);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar28,0x1000,0x4000,0,0,0,1,(int)local_898,0,0);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  endCommandBuffer(vk_00,*ppVVar28);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2f8);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar28);
  pAVar23 = geometry::Buffer::getAllocation((Buffer *)local_5e8);
  imagePixelAccess.m_data = (void *)::vk::Allocation::getMemory(pAVar23);
  VVar27 = ::vk::Allocation::getOffset(pAVar23);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,(VkDeviceMemory)imagePixelAccess.m_data,VVar27,bufferSize);
  local_8e0 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar10 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb8);
  iVar11 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb8);
  pvVar24 = ::vk::Allocation::getHostPtr(pAVar23);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_8d8,&local_8e0,iVar10,iVar11,1,pvVar24);
  context = (this->super_TestInstance).m_context;
  std::__cxx11::string::string((string *)&local_900,(string *)&this->m_name);
  bVar6 = compareWithFileImage(context,(ConstPixelBufferAccess *)local_8d8,&local_900);
  std::__cxx11::string::~string((string *)&local_900);
  if (((bVar6 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"Pass",&local_949);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_948);
    std::__cxx11::string::~string((string *)&local_948);
    std::allocator<char>::~allocator(&local_949);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"Fail",&local_921);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    std::allocator<char>::~allocator(&local_921);
  }
  local_928 = 1;
  geometry::Buffer::~Buffer((Buffer *)local_658);
  geometry::Buffer::~Buffer((Buffer *)local_5e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_3b8);
  std::__cxx11::string::~string((string *)local_370);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_2f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_298);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_228);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_1a8);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&colorSubRange.baseArrayLayer);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_100);
  geometry::Image::~Image((Image *)local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GeometryExpanderRenderTestInstance::iterate (void)
{
	const DeviceInterface&			vk						= m_context.getDeviceInterface();
	const VkDevice					device					= m_context.getDevice();
	const deUint32					queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	const VkQueue					queue					= m_context.getUniversalQueue();
	Allocator&						memAlloc				= m_context.getDefaultAllocator();
	const IVec2						resolution				= IVec2(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	const VkFormat					colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const Image						colorAttachmentImage	(
																vk,
																device,
																memAlloc,
																makeImageCreateInfo(resolution, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_BUFFER_USAGE_TRANSFER_SRC_BIT),
																MemoryRequirement::Any
															);
	const Unique<VkRenderPass>		renderPass				(makeRenderPass(vk, device, colorFormat));

	const Move<VkPipelineLayout>	pipelineLayout			(createPipelineLayout(vk, device));
	const VkImageSubresourceRange	colorSubRange			= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView>		colorAttachmentView		(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorSubRange));
	const Unique<VkFramebuffer>		framebuffer				(makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, resolution.x(), resolution.y(), 1u));
	const Unique<VkCommandPool>		cmdPool					(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer				(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const VkDeviceSize				vertexDataSizeBytes		= sizeInBytes(m_vertexPosData) + sizeInBytes(m_vertexAttrData);
	const deUint32					vertexPositionsOffset	= 0u;
	const deUint32					vertexAtrrOffset		= static_cast<deUint32>(sizeof(Vec4));
	const string					geometryShaderName		= (m_context.getBinaryCollection().contains("geometry_pointsize") && checkPointSize (m_context.getInstanceInterface(), m_context.getPhysicalDevice()))?
																"geometry_pointsize" : "geometry";

	const Unique<VkPipeline>		pipeline				(GraphicsPipelineBuilder()
																.setRenderSize			(resolution)
																.setShader				(vk, device, VK_SHADER_STAGE_VERTEX_BIT, m_context.getBinaryCollection().get("vertex"), DE_NULL)
																.setShader				(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT, m_context.getBinaryCollection().get(geometryShaderName), DE_NULL)
																.setShader				(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("fragment"), DE_NULL)
																.addVertexBinding		(makeVertexInputBindingDescription(0u, 2u*vertexAtrrOffset, VK_VERTEX_INPUT_RATE_VERTEX))
																.addVertexAttribute		(makeVertexInputAttributeDescription(0u, 0u, VK_FORMAT_R32G32B32A32_SFLOAT, vertexPositionsOffset))
																.addVertexAttribute		(makeVertexInputAttributeDescription(1u, 0u, VK_FORMAT_R32G32B32A32_SFLOAT, vertexAtrrOffset))
																.setPrimitiveTopology	(m_primitiveType)
																.build					(vk, device, *pipelineLayout, *renderPass));

	const VkDeviceSize				colorBufferSizeBytes	= resolution.x()*resolution.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer					colorBuffer				(vk, device, memAlloc, makeBufferCreateInfo(colorBufferSizeBytes,
																VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer					vertexBuffer			(vk, device, memAlloc, makeBufferCreateInfo(vertexDataSizeBytes,
																VK_BUFFER_USAGE_VERTEX_BUFFER_BIT ), MemoryRequirement::HostVisible);
	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		struct DataVec4
		{
			Vec4 pos;
			Vec4 color;
		};

		DataVec4* const pData = static_cast<DataVec4*>(alloc.getHostPtr());
		for(int ndx = 0; ndx < m_numDrawVertices; ++ndx)
		{
			pData[ndx].pos = m_vertexPosData[ndx];
			pData[ndx].color = m_vertexAttrData[ndx];
		}
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Draw commands
	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				*colorAttachmentImage, colorSubRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
						0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(resolution.x(), resolution.y()),
			};
			const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	{
		const VkBuffer buffers[] = { vertexBuffer.get()};
		const VkDeviceSize offsets[] = { vertexPositionsOffset };
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, DE_LENGTH_OF_ARRAY(buffers), buffers, offsets);
	}

	bindDescriptorSets(vk, device, memAlloc, *cmdBuffer, *pipelineLayout);

	drawCommand (*cmdBuffer);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				*colorAttachmentImage, colorSubRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(resolution.x(), resolution.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}

	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	{
		// Log the result image.
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);
		const tcu::ConstPixelBufferAccess imagePixelAccess(mapVkFormat(colorFormat), resolution.x(), resolution.y(), 1, colorBufferAlloc.getHostPtr());

		if (!compareWithFileImage(m_context, imagePixelAccess, m_name))
			return TestStatus::fail("Fail");
	}

	return TestStatus::pass("Pass");
}